

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

void proof_chain_start(sat_solver2 *s,clause *c)

{
  int iVar1;
  int ProofId;
  clause *c_local;
  sat_solver2 *s_local;
  
  if (s->fProofLogging != 0) {
    if (s->pInt2 != (Int2_Man_t *)0x0) {
      iVar1 = Int2_ManChainStart(s->pInt2,c);
      s->tempInter = iVar1;
    }
    if (s->pPrf2 != (Prf_Man_t *)0x0) {
      Prf_ManChainStart(s->pPrf2,c);
    }
    if (s->pPrf1 != (Vec_Set_t *)0x0) {
      iVar1 = clause2_proofid(s,c,0);
      if (iVar1 >> 2 < 1) {
        __assert_fail("(ProofId >> 2) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0xb3,"void proof_chain_start(sat_solver2 *, clause *)");
      }
      veci_resize(&s->temp_proof,0);
      veci_push(&s->temp_proof,0);
      veci_push(&s->temp_proof,0);
      veci_push(&s->temp_proof,iVar1);
    }
  }
  return;
}

Assistant:

static inline void proof_chain_start( sat_solver2* s, clause* c )
{
    if ( !s->fProofLogging )
        return;
    if ( s->pInt2 )
        s->tempInter = Int2_ManChainStart( s->pInt2, c );
    if ( s->pPrf2 )
        Prf_ManChainStart( s->pPrf2, c );
    if ( s->pPrf1 )
    {
        int ProofId = clause2_proofid(s, c, 0);
        assert( (ProofId >> 2) > 0 );
        veci_resize( &s->temp_proof, 0 );
        veci_push( &s->temp_proof, 0 );
        veci_push( &s->temp_proof, 0 );
        veci_push( &s->temp_proof, ProofId );
    }
}